

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_all.h
# Opt level: O3

void __thiscall
wasm::FindAll<wasm::StructNew>::FindAll(FindAll<wasm::StructNew> *this,Expression *ast)

{
  undefined1 auStack_108 [8];
  Finder finder;
  Expression *local_20;
  Expression *ast_local;
  
  (this->list).super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->list).super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_108 = (undefined1  [8])0x0;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.replacep = (Expression **)0x0;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.fixed._M_elems[9].currp
       = (Expression **)0x0;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.currFunction = (Function *)0x0
  ;
  finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
  super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.currModule = (Module *)this;
  local_20 = ast;
  Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::walk
            ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)auStack_108,&local_20)
  ;
  if (finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
      super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.fixed._M_elems[9].
      currp != (Expression **)0x0) {
    operator_delete(finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                    super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.fixed.
                    _M_elems[9].currp,
                    (long)finder.
                          super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                          super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.
                          flexible.
                          super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)finder.
                          super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                          super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.
                          fixed._M_elems[9].currp);
  }
  return;
}

Assistant:

FindAll(Expression* ast) {
    struct Finder
      : public PostWalker<Finder, UnifiedExpressionVisitor<Finder>> {
      std::vector<T*>* list;
      void visitExpression(Expression* curr) {
        if (curr->is<T>()) {
          (*list).push_back(curr->cast<T>());
        }
      }
    };
    Finder finder;
    finder.list = &list;
    finder.walk(ast);
  }